

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O2

void __thiscall
testing::internal::CartesianProductGenerator<const_trust_token_method_st_*,_bool>::
IteratorImpl<std::integer_sequence<unsigned_long,_0UL,_1UL>_>::ComputeCurrentValue
          (IteratorImpl<std::integer_sequence<unsigned_long,_0UL,_1UL>_> *this)

{
  bool bVar1;
  bool *__args_1;
  __shared_ptr<std::tuple<const_trust_token_method_st_*,_bool>,_(__gnu_cxx::_Lock_policy)2>
  _Stack_28;
  
  bVar1 = AtEnd(this);
  if (!bVar1) {
    __args_1 = (bool *)(**(code **)(*(long *)(this->current_).
                                             super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_trust_token_method_st_*>,_testing::internal::ParamIterator<bool>_>
                                             .
                                             super__Head_base<0UL,_testing::internal::ParamIterator<const_trust_token_method_st_*>,_false>
                                             ._M_head_impl.impl_._M_t.
                                             super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<const_trust_token_method_st_*>,_std::default_delete<testing::internal::ParamIteratorInterface<const_trust_token_method_st_*>_>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<const_trust_token_method_st_*>_*,_std::default_delete<testing::internal::ParamIteratorInterface<const_trust_token_method_st_*>_>_>
                                             .
                                             super__Head_base<0UL,_testing::internal::ParamIteratorInterface<const_trust_token_method_st_*>_*,_false>
                                   + 0x28))();
    (**(code **)(*(long *)(this->current_).
                          super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_trust_token_method_st_*>,_testing::internal::ParamIterator<bool>_>
                          .super__Tuple_impl<1UL,_testing::internal::ParamIterator<bool>_>.
                          super__Head_base<1UL,_testing::internal::ParamIterator<bool>,_false>.
                          _M_head_impl.impl_._M_t.
                          super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<bool>,_std::default_delete<testing::internal::ParamIteratorInterface<bool>_>_>
                + 0x28))();
    std::
    make_shared<std::tuple<trust_token_method_st_const*,bool>,trust_token_method_st_const*const&,bool_const&>
              ((trust_token_method_st **)&_Stack_28,__args_1);
    std::__shared_ptr<std::tuple<const_trust_token_method_st_*,_bool>,_(__gnu_cxx::_Lock_policy)2>::
    operator=(&(this->current_value_).
               super___shared_ptr<std::tuple<const_trust_token_method_st_*,_bool>,_(__gnu_cxx::_Lock_policy)2>
              ,&_Stack_28);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_28._M_refcount);
  }
  return;
}

Assistant:

void ComputeCurrentValue() {
      if (!AtEnd())
        current_value_ = std::make_shared<ParamType>(*std::get<I>(current_)...);
    }